

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedInstancing::Setup(AdvancedInstancing *this)

{
  AdvancedInstancing *this_local;
  
  glu::CallLogWrapper::glGenProgramPipelines
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_pipeline);
  this->m_fsp = 0;
  this->m_vsp = 0;
  glu::CallLogWrapper::glGenVertexArrays
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vertex_array);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vertex_buffer);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_index_buffer);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_object_id_buffer);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_transform_buffer);
  glu::CallLogWrapper::glGenTextures
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_transform_texture);
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenProgramPipelines(1, &m_pipeline);
		m_vsp = m_fsp = 0;
		glGenVertexArrays(2, m_vertex_array);
		glGenBuffers(1, &m_vertex_buffer);
		glGenBuffers(1, &m_index_buffer);
		glGenBuffers(1, &m_object_id_buffer);
		glGenBuffers(1, &m_transform_buffer);
		glGenTextures(1, &m_transform_texture);
		return NO_ERROR;
	}